

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O0

void __thiscall uWS::HttpResponse<true>::writeUnsignedHex(HttpResponse<true> *this,uint value)

{
  uint uVar1;
  uint32_t in_ESI;
  AsyncSocket<true> *in_RDI;
  int length;
  char buf [10];
  char local_16 [22];
  
  uVar1 = utils::u32toaHex(in_ESI,local_16);
  AsyncSocket<true>::write(in_RDI,(int)local_16,(void *)(ulong)uVar1,0);
  return;
}

Assistant:

void writeUnsignedHex(unsigned int value) {
        char buf[10];
        int length = utils::u32toaHex(value, buf);

        /* For now we do this copy */
        Super::write(buf, length);
    }